

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedFieldNoLock(MapFieldBase *this)

{
  bool bVar1;
  uint32_t uVar2;
  int32_t value;
  int value_00;
  ReflectionPayload *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *this_01;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  Rep *pRVar3;
  ReflectionPayload *pRVar4;
  uint64_t uVar5;
  Message *this_02;
  Message *pMVar6;
  int64_t value_01;
  Reflection *this_03;
  ReflectionPayload *pRVar7;
  float value_02;
  double value_03;
  string_view value_04;
  Metadata MVar8;
  MapValueRef map_val;
  ScratchSpace map_key_scratch_space;
  MapKey map_key;
  MapValueRef local_90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  KeyValue local_78;
  undefined4 local_68;
  string local_60;
  ReflectionPayload *local_40;
  MapFieldBase *local_38;
  
  if (*(undefined4 *)((long)&this[1].super_MapFieldBaseForParse.payload_._M_i + 4) != 1) {
    UntypedMapBase::ClearTableImpl((UntypedMapBase *)(this + 1),true);
  }
  local_38 = this;
  this_00 = payload(this);
  if ((this_00->repeated_field).super_RepeatedPtrFieldBase.current_size_ != 0) {
    this_01 = RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                        ((RepeatedPtrFieldBase *)this_00,0);
    MVar8 = Message::GetMetadata(this_01);
    this_03 = MVar8.reflection;
    MVar8 = Message::GetMetadata(this_01);
    field = Descriptor::map_key(MVar8.descriptor);
    field_00 = Descriptor::map_value(MVar8.descriptor);
    pRVar7 = this_00;
    if (((ulong)(this_00->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ & 1) != 0)
    {
      pRVar3 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      pRVar7 = (ReflectionPayload *)pRVar3->elements;
    }
    pRVar4 = this_00;
    if (((ulong)(this_00->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ & 1) != 0)
    {
      pRVar3 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      pRVar4 = (ReflectionPayload *)pRVar3->elements;
    }
    local_40 = (ReflectionPayload *)
               (&(pRVar4->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_ +
               (this_00->repeated_field).super_RepeatedPtrFieldBase.current_size_);
    if (pRVar7 != local_40) {
      do {
        pMVar6 = (Message *)(pRVar7->repeated_field).super_RepeatedPtrFieldBase.tagged_rep_or_elem_;
        local_80._M_head_impl =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_68 = 0;
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
        case 1:
          uVar2 = Reflection::GetInt32(this_03,pMVar6,field);
          local_68 = 1;
          goto LAB_002a2b2d;
        case 2:
          uVar5 = Reflection::GetInt64(this_03,pMVar6,field);
          local_68 = 2;
          goto LAB_002a2b49;
        case 3:
          uVar2 = Reflection::GetUInt32(this_03,pMVar6,field);
          local_68 = 3;
LAB_002a2b2d:
          local_78.uint32_value = uVar2;
          break;
        case 4:
          uVar5 = Reflection::GetUInt64(this_03,pMVar6,field);
          local_68 = 4;
LAB_002a2b49:
          local_78.uint64_value = uVar5;
          break;
        default:
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                      ,0x1bc);
        case 7:
          bVar1 = Reflection::GetBool(this_03,pMVar6,field);
          local_68 = 7;
          local_78.bool_value = bVar1;
          break;
        case 9:
          local_78.string_value =
               Reflection::GetStringView(this_03,pMVar6,field,(ScratchSpace *)&local_80);
          local_68 = 9;
        }
        local_90.super_MapValueConstRef.data_ = (void *)0x0;
        local_90.super_MapValueConstRef.type_ =
             *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_00->type_ * 4);
        InsertOrLookupMapValueNoSync(local_38,(MapKey *)&local_78.string_value,&local_90);
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_00->type_ * 4)) {
        case 1:
          value = Reflection::GetInt32(this_03,pMVar6,field_00);
          MapValueRef::SetInt32Value(&local_90,value);
          break;
        case 2:
          value_01 = Reflection::GetInt64(this_03,pMVar6,field_00);
          MapValueRef::SetInt64Value(&local_90,value_01);
          break;
        case 3:
          uVar2 = Reflection::GetUInt32(this_03,pMVar6,field_00);
          MapValueRef::SetUInt32Value(&local_90,uVar2);
          break;
        case 4:
          uVar5 = Reflection::GetUInt64(this_03,pMVar6,field_00);
          MapValueRef::SetUInt64Value(&local_90,uVar5);
          break;
        case 5:
          value_03 = Reflection::GetDouble(this_03,pMVar6,field_00);
          MapValueRef::SetDoubleValue(&local_90,value_03);
          break;
        case 6:
          value_02 = Reflection::GetFloat(this_03,pMVar6,field_00);
          MapValueRef::SetFloatValue(&local_90,value_02);
          break;
        case 7:
          bVar1 = Reflection::GetBool(this_03,pMVar6,field_00);
          MapValueRef::SetBoolValue(&local_90,bVar1);
          break;
        case 8:
          value_00 = Reflection::GetEnumValue(this_03,pMVar6,field_00);
          MapValueRef::SetEnumValue(&local_90,value_00);
          break;
        case 9:
          Reflection::GetString_abi_cxx11_(&local_60,this_03,pMVar6,field_00);
          value_04._M_str = local_60._M_dataplus._M_p;
          value_04._M_len = local_60._M_string_length;
          MapValueRef::SetStringValue(&local_90,value_04);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          break;
        case 10:
          this_02 = MapValueRef::MutableMessageValue(&local_90);
          pMVar6 = Reflection::GetMessage(this_03,pMVar6,field_00,(MessageFactory *)0x0);
          Message::CopyFrom(this_02,pMVar6);
        }
        if (local_80._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80._M_head_impl);
        }
        pRVar7 = (ReflectionPayload *)
                 &(pRVar7->repeated_field).super_RepeatedPtrFieldBase.current_size_;
      } while (pRVar7 != local_40);
    }
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedFieldNoLock() {
  ClearMapNoSync();

  RepeatedPtrField<Message>& rep = payload().repeated_field;

  if (rep.empty()) return;

  const Message* prototype = &rep[0];
  const Reflection* reflection = prototype->GetReflection();
  const Descriptor* descriptor = prototype->GetDescriptor();
  const FieldDescriptor* key_des = descriptor->map_key();
  const FieldDescriptor* val_des = descriptor->map_value();

  for (const Message& elem : rep) {
    // MapKey type will be set later.
    Reflection::ScratchSpace map_key_scratch_space;
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(
            reflection->GetStringView(elem, key_des, map_key_scratch_space));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(elem, key_des));
        break;
      default:
        Unreachable();
    }

    MapValueRef map_val;
    map_val.SetType(val_des->cpp_type());
    InsertOrLookupMapValueNoSync(map_key, &map_val);

    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                    \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                              \
    map_val.Set##METHOD##Value(reflection->Get##METHOD(elem, val_des)); \
    break;
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(STRING, String);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_ENUM:
        map_val.SetEnumValue(reflection->GetEnumValue(elem, val_des));
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val.MutableMessageValue()->CopyFrom(
            reflection->GetMessage(elem, val_des));
        break;
      }
    }
  }
}